

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O1

string * upperCaseFirst(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  iVar3 = toupper((int)*pcVar2);
  *pcVar2 = (char)iVar3;
  return __return_storage_ptr__;
}

Assistant:

std::string upperCaseFirst (const std::string& input)
{
  std::string output {input};
  output[0] = toupper (output[0]);
  return output;
}